

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckVariableAttribute
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  undefined8 print_statement_00;
  ulong uVar2;
  allocator local_f1;
  string local_f0;
  string local_d0;
  char *local_b0;
  char *message;
  PatternType pattern_type;
  string title;
  undefined1 local_70 [8];
  regex pattern;
  size_type found;
  undefined1 local_40 [8];
  string table_name;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  table_name.field_2._8_8_ = print_statement;
  GetTableName((string *)local_40,sql_statement);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (pattern._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::string::find(local_40,0x23f5c6),
     pattern._M_automaton.
     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_70,"(attribute)",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&pattern_type,"Entity-Attribute-Value Pattern",
               (allocator *)((long)&message + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&message + 7));
    print_statement_00 = table_name.field_2._8_8_;
    message._0_4_ = 2;
    local_b0 = anon_var_dwarf_900e2;
    std::__cxx11::string::string((string *)&local_d0,(string *)&pattern_type);
    pcVar1 = local_b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,pcVar1,&local_f1);
    CheckPattern(state,sql_statement,(bool *)print_statement_00,(regex *)local_70,RISK_LEVEL_MEDIUM,
                 PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_d0,&local_f0,true,0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&pattern_type);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_70);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CheckVariableAttribute(Configuration& state,
                            const std::string& sql_statement,
                            bool& print_statement){

  std::string table_name = GetTableName(sql_statement);
  if(table_name.empty()){
    return;
  }

  auto found = table_name.find("attribute");
  if (found == std::string::npos) {
    return;
  }

  std::regex pattern("(attribute)");
  std::string title = "Entity-Attribute-Value Pattern";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Dynamic schema with variable attributes:  "
      "Are you trying to create a schema where you can define new attributes "
      "at runtime.? This involves storing attributes as rows in an attribute table. "
      "This is referred to as the Entity-Attribute-Value or schemaless pattern. "
      "When you use this pattern,  you sacrifice many advantages that a conventional "
      "database design would have given you. You can't make mandatory attributes. "
      "You can't enforce referential integrity. You might find that attributes are "
      "not being named consistently. A solution is to store all related types in one table, "
      "with distinct columns for every attribute that exists in any type "
      "(Single Table Inheritance). Use one attribute to define the subtype of a given row. "
      "Many attributes are subtype-specific, and these columns must "
      "be given a null value on any row storing an object for which the attribute "
      "does not apply; the columns with non-null values become sparse. "
      "Another solution is to create a separate table for each subtype "
      "(Concrete Table Inheritance). A third solution mimics inheritance, "
      "as though tables were object-oriented classes (Class Table Inheritance). "
      "Create a single table for the base type, containing attributes common to "
      "all subtypes. Then for each subtype, create another table, with a primary key "
      "that also serves as a foreign key to the base table. "
      "If you have many subtypes or if you must support new attributes frequently, "
      "you can add a BLOB column to store data in a format such as XML or JSON, "
      "which encodes both the attribute names and their values. "
      "This design is best when you can’t limit yourself to a finite set of subtypes "
      "and when you need complete flexibility to define new attributes at any time.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true);

}